

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip.c
# Opt level: O1

void test_write_format_zip64(void)

{
  int iVar1;
  void *buff;
  archive *paVar2;
  size_t used;
  size_t local_38;
  
  buff = malloc(1000000);
  paVar2 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip.c"
                   ,L'Ʌ',(uint)(paVar2 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_zip(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip.c"
                      ,L'Ɇ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_zip(a)",paVar2);
  iVar1 = archive_write_add_filter_none(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip.c"
                      ,L'ɇ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_none(a)",paVar2);
  iVar1 = archive_write_set_options(paVar2,"zip:zip64");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip.c"
                      ,L'ɉ',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_set_options(a, \"zip:zip64\")",paVar2);
  iVar1 = archive_write_set_options(paVar2,"zip:experimental");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip.c"
                      ,L'ɋ',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_set_options(a, \"zip:experimental\")",paVar2);
  iVar1 = archive_write_set_options(paVar2,"zip:experimental");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip.c"
                      ,L'ɍ',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_set_options(a, \"zip:experimental\")",paVar2);
  iVar1 = archive_write_open_memory(paVar2,buff,1000000,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip.c"
                      ,L'ɏ',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, buffsize, &used)",paVar2);
  write_contents(paVar2);
  dumpfile("constructed64.zip",buff,local_38);
  paVar2 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip.c"
                   ,L'ɗ',(uint)(paVar2 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip.c"
                      ,L'ɘ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar2)
  ;
  iVar1 = archive_read_support_filter_all(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip.c"
                      ,L'ə',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar2)
  ;
  iVar1 = archive_read_open_memory(paVar2,buff,local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip.c"
                      ,L'ɚ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_memory(a, buff, used)",
                      paVar2);
  verify_contents(paVar2,1);
  paVar2 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip.c"
                   ,L'ɞ',(uint)(paVar2 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip.c"
                      ,L'ɟ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar2)
  ;
  iVar1 = archive_read_support_filter_all(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip.c"
                      ,L'ɠ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar2)
  ;
  iVar1 = read_open_memory(paVar2,buff,local_38,7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip.c"
                      ,L'ɡ',0,"ARCHIVE_OK",(long)iVar1,"read_open_memory(a, buff, used, 7)",paVar2)
  ;
  verify_contents(paVar2,0);
  paVar2 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip.c"
                   ,L'ɦ',(uint)(paVar2 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip.c"
                      ,L'ɧ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar2)
  ;
  iVar1 = archive_read_support_filter_all(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip.c"
                      ,L'ɨ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar2)
  ;
  iVar1 = read_open_memory_seek(paVar2,buff,local_38,7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip.c"
                      ,L'ɩ',0,"ARCHIVE_OK",(long)iVar1,"read_open_memory_seek(a, buff, used, 7)",
                      paVar2);
  verify_contents(paVar2,1);
  free(buff);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_zip64)
{
	struct archive *a;
	size_t used;
	size_t buffsize = 1000000;
	char *buff;

	buff = malloc(buffsize);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "zip:zip64"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "zip:experimental"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "zip:experimental"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used));
	write_contents(a);
	dumpfile("constructed64.zip", buff, used);

	/*
	 * Now, read the data back.
	 */
	/* With the standard memory reader. */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, used));
	verify_contents(a, 1);

	/* With the test memory reader -- streaming mode. */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, read_open_memory(a, buff, used, 7));
	/* Streaming reader doesn't see mode information from Central Directory. */
	verify_contents(a, 0);

	/* With the test memory reader -- seeking mode. */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, read_open_memory_seek(a, buff, used, 7));
	verify_contents(a, 1);

	free(buff);
}